

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O3

size_t cesl_int_to_str(int value,char *dst_str,uint8_t base)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  undefined7 in_register_00000011;
  char cVar9;
  char acStack_28 [40];
  
  iVar8 = (int)CONCAT71(in_register_00000011,base);
  uVar4 = (ulong)(uint)-value;
  if (-1 < value || iVar8 != 10) {
    uVar4 = (ulong)(uint)value;
  }
  sVar7 = 0;
  do {
    sVar6 = sVar7;
    iVar3 = (int)uVar4;
    uVar1 = (long)iVar3 / (long)iVar8;
    uVar4 = uVar1 & 0xffffffff;
    cVar2 = (char)(iVar3 % iVar8);
    cVar9 = 'W';
    if (cVar2 < '\n') {
      cVar9 = '0';
    }
    acStack_28[sVar6] = cVar9 + cVar2;
    sVar7 = sVar6 + 1;
  } while ((int)uVar1 != 0);
  if ((long)sVar7 < 1) {
    __assert_fail("(len > 0)&&(\"cesl_int32_to_str negative lenght\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                  ,0x49,"size_t cesl_int32_to_str(int32_t, char *, uint8_t)");
  }
  pcVar5 = acStack_28 + sVar6 + 1;
  if (-1 >= value && iVar8 == 10) {
    *dst_str = '-';
    dst_str = dst_str + 1;
    sVar7 = sVar6 + 2;
  }
  for (; acStack_28 < pcVar5; pcVar5 = pcVar5 + -1) {
    *dst_str = pcVar5[-1];
    dst_str = dst_str + 1;
  }
  *dst_str = '\0';
  return sVar7;
}

Assistant:

size_t cesl_int_to_str(int value, char* dst_str, uint8_t base)
{
#if (INT_MAX == INT64_MAX)
    return cesl_int64_to_str(value, dst_str, base);
#elif (INT_MAX == INT32_MAX)
    return cesl_int32_to_str(value, dst_str, base);
#else
#error cesl_int_to_string__not_supported_on_this_platfform
#endif
}